

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleGenerateCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  pointer pbVar6;
  string output;
  string condition;
  string input;
  string local_88;
  string local_68;
  string local_48;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x81) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Incorrect arguments to GENERATE subcommand.","");
    cmCommand::SetError(&this->super_cmCommand,&local_68);
LAB_003b1ac5:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    return false;
  }
  iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + 1));
  if (iVar3 != 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Incorrect arguments to GENERATE subcommand.","");
    cmCommand::SetError(&this->super_cmCommand,&local_68);
    goto LAB_003b1ac5;
  }
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0xa1) {
LAB_003b1b8e:
    pcVar2 = pbVar6[2]._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + pbVar6[2]._M_string_length);
    iVar3 = std::__cxx11::string::compare
                      ((char *)((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 3));
    if ((iVar3 == 0) ||
       (iVar4 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 3)), iVar4 == 0)) {
      pbVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = pbVar6[4]._M_dataplus._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + pbVar6[4]._M_string_length);
      AddEvaluationFile(this,&local_48,&local_88,&local_68,iVar3 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar5 = true;
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Incorrect arguments to GENERATE subcommand.","");
      cmCommand::SetError(&this->super_cmCommand,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)(pbVar6 + 5));
    if (iVar3 == 0) {
      if ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start == 0xe0) {
        std::__cxx11::string::_M_assign((string *)&local_68);
        if (local_68._M_string_length != 0) {
          pbVar6 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_003b1b8e;
        }
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,
                   "CONDITION of sub-command GENERATE must not be empty if specified.","");
        cmCommand::SetError(&this->super_cmCommand,&local_88);
      }
      else {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"Incorrect arguments to GENERATE subcommand.","");
        cmCommand::SetError(&this->super_cmCommand,&local_88);
      }
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Incorrect arguments to GENERATE subcommand.","");
      cmCommand::SetError(&this->super_cmCommand,&local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    return bVar5;
  }
  operator_delete(local_68._M_dataplus._M_p,
                  CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                           local_68.field_2._M_local_buf[0]) + 1);
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleGenerateCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 5)
    {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
    }
  if (args[1] != "OUTPUT")
    {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
    }
  std::string condition;
  if (args.size() > 5)
    {
    if (args[5] != "CONDITION")
      {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
      }
    if (args.size() != 7)
      {
      this->SetError("Incorrect arguments to GENERATE subcommand.");
      return false;
      }
    condition = args[6];
    if (condition.empty())
      {
      this->SetError("CONDITION of sub-command GENERATE must not be empty if "
        "specified.");
      return false;
      }
    }
  std::string output = args[2];
  const bool inputIsContent = args[3] != "INPUT";
  if (inputIsContent && args[3] != "CONTENT")
    {
    this->SetError("Incorrect arguments to GENERATE subcommand.");
    return false;
    }
  std::string input = args[4];

  this->AddEvaluationFile(input, output, condition, inputIsContent);
  return true;
}